

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O1

JsErrorCode
JsAllocRawData(JsRuntimeHandle runtimeHandle,size_t sizeInBytes,bool zeroed,JsRef *buffer)

{
  ThreadContext *threadContext;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Recycler *pRVar4;
  undefined4 *puVar5;
  char *pcVar6;
  JsErrorCode JVar7;
  JsrtRuntime *runtime;
  undefined1 local_a0 [8];
  TrackAllocData data;
  TrackAllocData data_1;
  undefined1 local_48 [8];
  ThreadContextScope scope;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (buffer == (JsRef *)0x0) {
    return JsErrorNullArgument;
  }
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&scope.originalContext + 4),
             ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    JVar7 = JsErrorInvalidArgument;
  }
  else {
    ThreadContext::ValidateThreadContext(*runtimeHandle);
    threadContext = *runtimeHandle;
    ThreadContextScope::ThreadContextScope((ThreadContextScope *)local_48,threadContext);
    JVar7 = JsErrorWrongThread;
    if (local_48[1] == true) {
      pRVar4 = threadContext->recycler;
      if (zeroed) {
        data._32_8_ = &char::typeinfo;
        pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,(TrackAllocData *)&data.line);
        if (sizeInBytes == 0) {
          pcVar6 = &DAT_00000008;
          Memory::Recycler::ClearTrackAllocInfo(pRVar4,(TrackAllocData *)0x0);
        }
        else {
          BVar3 = ExceptionCheck::CanHandleOutOfMemory();
          if (BVar3 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                               ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                               "ExceptionCheck::CanHandleOutOfMemory()");
            if (!bVar2) goto LAB_003cf41f;
            *puVar5 = 0;
          }
          pcVar6 = Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                             (pRVar4,sizeInBytes);
          if (pcVar6 == (char *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                               ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
LAB_003cf239:
            if (bVar2 == false) goto LAB_003cf41f;
            *puVar5 = 0;
          }
        }
      }
      else {
        local_a0 = (undefined1  [8])&char::typeinfo;
        data.typeinfo = (type_info *)0x0;
        data.count = (size_t)anon_var_dwarf_6a6a24;
        data.filename._0_4_ = 0x5b1;
        data.plusSize = sizeInBytes;
        pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,(TrackAllocData *)local_a0);
        if (sizeInBytes == 0) {
          pcVar6 = &DAT_00000008;
          Memory::Recycler::ClearTrackAllocInfo(pRVar4,(TrackAllocData *)0x0);
        }
        else {
          BVar3 = ExceptionCheck::CanHandleOutOfMemory();
          if (BVar3 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                               ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                               "ExceptionCheck::CanHandleOutOfMemory()");
            if (!bVar2) goto LAB_003cf41f;
            *puVar5 = 0;
          }
          pcVar6 = Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                             (pRVar4,sizeInBytes);
          if (pcVar6 == (char *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                               ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
            goto LAB_003cf239;
          }
        }
      }
      *buffer = pcVar6;
      JVar7 = JsNoError;
    }
    ThreadContextScope::~ThreadContextScope((ThreadContextScope *)local_48);
  }
  if (0xfffffffd < JVar7 - JsErrorNotImplemented) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/../JsrtInternal.h"
                       ,0x89,
                       "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                       ,
                       "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                      );
    if (!bVar2) {
LAB_003cf41f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&scope.originalContext + 4));
  return JVar7;
}

Assistant:

CHAKRA_API JsAllocRawData(_In_ JsRuntimeHandle runtimeHandle, _In_ size_t sizeInBytes, _In_ bool zeroed, _Out_ JsRef * buffer)
{
    PARAM_NOT_NULL(buffer);

    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        ThreadContext * threadContext = JsrtRuntime::FromHandle(runtimeHandle)->GetThreadContext();
        ThreadContextScope scope(threadContext);

        if (!scope.IsValid())
        {
            return JsErrorWrongThread;
        }

        Recycler * recycler = threadContext->GetRecycler();
        *buffer = zeroed
            ? RecyclerNewArrayZ(recycler, char, sizeInBytes)
            : RecyclerNewArray(recycler, char, sizeInBytes);
        return JsNoError;
    });
}